

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::relative_path(path *__return_storage_ptr__,path *this)

{
  bool bVar1;
  size_type sVar2;
  unsigned_long local_48;
  string_type local_40;
  unsigned_long local_20;
  size_type rootPathLen;
  path *this_local;
  
  rootPathLen = (size_type)this;
  this_local = __return_storage_ptr__;
  sVar2 = root_name_length(this);
  bVar1 = has_root_directory(this);
  local_20 = sVar2 + bVar1;
  local_48 = std::__cxx11::string::length();
  std::min<unsigned_long>(&local_20,&local_48);
  std::__cxx11::string::substr((ulong)&local_40,(ulong)this);
  path(__return_storage_ptr__,&local_40,generic_format);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::relative_path() const
{
    auto rootPathLen = _prefixLength + root_name_length() + (has_root_directory() ? 1 : 0);
    return path(_path.substr((std::min)(rootPathLen, _path.length())), generic_format);
}